

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O0

void com_mc_affine(com_core_t *core,pel *pred_buf)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  pel *in_RSI;
  long *in_RDI;
  int i_1;
  int i;
  int blk_dim;
  int i_dstc;
  int i_dstl;
  pel *dstc;
  pel *dstl;
  int lidx_base;
  int lidx;
  int bi;
  int sub_blk_size;
  pel pred_snd [24576];
  com_pic_t *ref_pic;
  s8 *refi;
  com_ref_pic_t (*refp) [2];
  int cu_height;
  int cu_width;
  int y;
  int x;
  com_pic_t *pic;
  int qpel_gmv_y;
  int qpel_gmv_x;
  int base_y;
  int i_src;
  int widx;
  int max_posy;
  int max_posx;
  int max_val;
  com_seqh_t *seqhdr;
  s32 (*asb_mv) [2];
  int h;
  int w;
  pel *src;
  int dy;
  int dx;
  s8 (*coeff) [8];
  int qpel_gmv_y_2;
  int qpel_gmv_x_2;
  int base_y_2;
  int qpel_gmv_y_1;
  int qpel_gmv_x_1;
  int mv_scale_tmp_ver;
  int mv_scale_tmp_hor;
  int base_y_1;
  s32 (*asb_mv1) [2];
  int i_src_1;
  int i_asb_mv;
  int max_posy_1;
  int max_posx_1;
  int max_val_1;
  com_seqh_t *seqhdr_1;
  s32 (*asb_mv0) [2];
  int h_1;
  int w_1;
  pel *src_2;
  s8 (*coeff_2) [4];
  int dy_2;
  int dx_2;
  pel *src_1;
  s8 (*coeff_1) [4];
  int dy_1;
  int dx_1;
  int local_6328;
  int local_6324;
  int local_6320;
  int local_631c;
  int local_6318;
  int local_6314;
  int local_6310;
  int local_630c;
  int local_6308;
  int local_6304;
  int local_6300;
  int local_62fc;
  int local_62f0;
  int local_62ec;
  int local_62e8;
  int local_62e4;
  int local_62e0;
  int local_62dc;
  bool local_62d5;
  int local_62d4;
  int local_62d0;
  int local_62c8;
  int local_62c4;
  pel *local_62c0;
  pel *local_62b8;
  uint local_62ac;
  int local_62a4;
  pel local_62a0 [24576];
  long local_2a0;
  char *local_298;
  long *local_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  long local_278;
  pel *local_270;
  long *local_268;
  uint local_260;
  uint local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  long local_240;
  int *local_238;
  int local_230;
  int local_22c;
  uint local_228;
  int local_224;
  long local_220;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  pel *local_200;
  long *local_1f8;
  pel *local_1f0;
  uint local_1e8;
  uint local_1e4;
  tab_s8 (*local_1e0) [8];
  undefined4 local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  pel *local_1b0;
  int local_1a4;
  long local_1a0;
  uint local_198;
  uint local_194;
  int local_190;
  uint local_18c;
  uint local_188;
  int local_184;
  int local_180;
  int local_17c;
  int *local_178;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  long local_158;
  int *local_150;
  int local_148;
  int local_144;
  uint local_140;
  int local_13c;
  long local_138;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  pel *local_118;
  long *local_110;
  pel *local_108;
  tab_s8 (*local_100) [4];
  uint local_f8;
  uint local_f4;
  undefined4 local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  pel *local_c8;
  int local_bc;
  long local_b8;
  pel *local_b0;
  tab_s8 (*local_a8) [4];
  uint local_a0;
  uint local_9c;
  undefined4 local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  pel *local_70;
  int local_64;
  long local_60;
  int local_54;
  long local_50;
  int local_44;
  long local_40;
  int local_34;
  long local_30;
  
  local_278 = in_RDI[0x8dc];
  local_27c = (int)in_RDI[0x80e];
  local_280 = *(int *)((long)in_RDI + 0x4074);
  local_284 = (int)in_RDI[0x810];
  local_288 = *(int *)((long)in_RDI + 0x4084);
  local_290 = in_RDI + 0x854;
  local_298 = (char *)((long)in_RDI + 0x1a);
  local_62d5 = false;
  if (-1 < *local_298) {
    local_62d5 = -1 < *(char *)((long)in_RDI + 0x1b);
  }
  uVar2 = (uint)local_62d5;
  cVar1 = *local_298;
  iVar3 = local_284 * local_288;
  if ((*(int *)(in_RDI[0x8fb] + 0x3d4) == 1) ||
     ((-1 < *local_298 && (-1 < *(char *)((long)in_RDI + 0x1b))))) {
    local_62a4 = 8;
  }
  else {
    local_62a4 = 4;
  }
  local_62ac = (uint)(cVar1 < '\0');
  local_270 = in_RSI;
  local_268 = in_RDI;
  for (local_62d0 = 0; local_62d0 <= (int)uVar2; local_62d0 = local_62d0 + 1) {
    local_2a0 = local_290[(long)local_298[(int)local_62ac] * 8 + (long)(int)local_62ac * 4];
    if (local_62d0 == 0) {
      if ((uVar2 == 0) && (*(int *)((long)local_268 + 0x14) == 0)) {
        local_62c4 = *(int *)(local_278 + 0x18);
        local_62b8 = (pel *)(*(long *)(local_278 + 8) + (long)(local_280 * local_62c4) +
                            (long)local_27c);
      }
      else {
        local_62c4 = local_284;
        local_62b8 = local_270;
      }
    }
    else {
      local_62c4 = local_284;
      local_62b8 = local_62a0;
    }
    local_1f8 = local_268;
    local_200 = local_62b8;
    local_204 = local_62c4;
    local_208 = local_27c;
    local_20c = local_280;
    local_210 = local_284;
    local_214 = local_288;
    local_224 = local_62a4;
    local_228 = local_62ac;
    local_238 = (int *)((long)local_268 + (long)(int)local_62ac * 0x2000 + 0x6c);
    local_240 = *local_268;
    local_244 = (1 << ((byte)*(undefined4 *)(local_240 + 0x13f8) & 0x1f)) + -1;
    local_248 = *(int *)(local_240 + 0x13c8) + 4;
    local_24c = *(int *)(local_240 + 0x13cc) + 4;
    local_250 = g_tbl_log2[local_62a4] + -2;
    local_254 = *(int *)(local_2a0 + 0x18);
    local_220 = local_2a0;
    for (local_230 = 0; local_230 < local_214; local_230 = local_224 + local_230) {
      local_258 = (local_20c + local_230) * 0x10;
      for (local_22c = 0; local_22c < local_210; local_22c = local_224 + local_22c) {
        local_25c = (local_208 + local_22c) * 0x10 + *local_238;
        local_260 = local_258 + local_238[1];
        local_1b0 = local_200 + local_22c;
        local_1a0 = local_220;
        local_1a4 = local_254;
        local_1b4 = local_204;
        local_1c0 = local_224;
        local_1c4 = local_224;
        local_1c8 = local_250;
        local_1cc = local_248;
        local_1d0 = local_24c;
        local_1d4 = local_244;
        local_1d8 = 1;
        local_1e4 = local_25c & 0xf;
        local_1e8 = local_260 & 0xf;
        local_62e4 = (int)local_25c >> 4;
        local_62f0 = (int)local_260 >> 4;
        local_1e0 = g_tbl_mc_coeff_luma_hp;
        local_62dc = local_62e4;
        if (local_248 < local_62e4) {
          local_62dc = local_248;
        }
        if (local_62dc < -0x84) {
          local_62e0 = -0x84;
        }
        else {
          if (local_248 < local_62e4) {
            local_62e4 = local_248;
          }
          local_62e0 = local_62e4;
        }
        local_1b8 = local_62e0;
        local_62e8 = local_62f0;
        if (local_24c < local_62f0) {
          local_62e8 = local_24c;
        }
        if (local_62e8 < -0x84) {
          local_62ec = -0x84;
        }
        else {
          if (local_24c < local_62f0) {
            local_62f0 = local_24c;
          }
          local_62ec = local_62f0;
        }
        local_1bc = local_62ec;
        local_34 = local_62ec + local_224 + 4;
        local_30 = local_220;
        if (*(int *)(local_220 + 0x1b8) < local_34) {
          pthread_mutex_lock((pthread_mutex_t *)(local_220 + 0x1c0));
          while (*(int *)(local_30 + 0x1b8) < local_34) {
            pthread_cond_wait((pthread_cond_t *)(local_30 + 0x1e8),
                              (pthread_mutex_t *)(local_30 + 0x1c0));
          }
          pthread_mutex_unlock((pthread_mutex_t *)(local_30 + 0x1c0));
        }
        local_1f0 = (pel *)(*(long *)(local_1a0 + 8) + (long)(local_1bc * local_1a4) +
                           (long)local_1b8);
        if ((local_1e4 == 0) && (local_1e8 == 0)) {
          (*uavs3d_funs_handle.ipcpy[local_1c8])
                    (local_1f0,local_1a4,local_1b0,local_1b4,local_1c0,local_1c4);
        }
        else if (local_1e8 == 0) {
          (*uavs3d_funs_handle.ipflt[0][local_1c8])
                    (local_1f0,local_1a4,local_1b0,local_1b4,local_1c0,local_1c4,
                     local_1e0[(int)local_1e4],local_1d4);
        }
        else if (local_1e4 == 0) {
          (*uavs3d_funs_handle.ipflt[2][local_1c8])
                    (local_1f0,local_1a4,local_1b0,local_1b4,local_1c0,local_1c4,
                     local_1e0[(int)local_1e8],local_1d4);
        }
        else {
          (*uavs3d_funs_handle.ipflt_ext[0][local_1c8])
                    (local_1f0,local_1a4,local_1b0,local_1b4,local_1c0,local_1c4,
                     local_1e0[(int)local_1e4],local_1e0[(int)local_1e8],local_1d4);
        }
        local_238 = local_238 + 2;
      }
      local_200 = local_200 + local_224 * local_204;
    }
    local_62ac = (uint)((local_62ac != 0 ^ 0xffU) & 1);
  }
  if (uVar2 != 0) {
    if (*(int *)((long)local_268 + 0x14) == 0) {
      local_62c4 = *(int *)(local_278 + 0x18);
      local_62b8 = (pel *)(*(long *)(local_278 + 8) + (long)(local_280 * local_62c4) +
                          (long)local_27c);
    }
    else {
      local_62c4 = local_284;
      local_62b8 = local_270;
    }
    (*uavs3d_funs_handle.avg_pel[(int)local_268[0x80f] + -2])
              (local_62b8,local_62c4,local_270,local_62a0,local_284,local_288);
  }
  local_62ac = (uint)(cVar1 < '\0');
  for (local_62d4 = 0; local_62d4 <= (int)uVar2; local_62d4 = local_62d4 + 1) {
    local_2a0 = local_290[(long)local_298[(int)local_62ac] * 8 + (long)(int)local_62ac * 4];
    if (local_62d4 == 0) {
      if ((uVar2 == 0) && ((short)local_268[3] == 0)) {
        local_62c8 = *(int *)(local_278 + 0x1c);
        local_62c0 = (pel *)(*(long *)(local_278 + 0x10) + (long)((local_280 / 2) * local_62c8) +
                            (long)local_27c);
      }
      else {
        local_62c8 = local_284;
        local_62c0 = local_270 + iVar3;
      }
    }
    else {
      local_62c8 = local_284;
      local_62c0 = local_62a0;
    }
    local_110 = local_268;
    local_118 = local_62c0;
    local_11c = local_62c8;
    local_120 = local_27c;
    local_124 = local_280;
    local_128 = local_284;
    local_12c = local_288;
    local_13c = local_62a4;
    local_140 = local_62ac;
    local_150 = (int *)((long)local_268 + (long)(int)local_62ac * 0x2000 + 0x6c);
    local_158 = *local_268;
    local_15c = (1 << ((byte)*(undefined4 *)(local_158 + 0x13f8) & 0x1f)) + -1;
    local_160 = *(int *)(local_158 + 0x13c8) + 4 >> 1;
    local_164 = *(int *)(local_158 + 0x13cc) + 4 >> 1;
    local_168 = local_284 >> 2;
    local_16c = *(int *)(local_2a0 + 0x1c);
    local_138 = local_2a0;
    if (local_62a4 == 4) {
      local_178 = local_150 + (long)local_168 * 2;
      for (local_148 = 0; local_148 < local_12c; local_148 = local_148 + 8) {
        local_17c = (local_124 + local_148) * 0x10;
        for (local_144 = 0; local_144 < local_128; local_144 = local_144 + 8) {
          local_180 = *local_150 + local_150[2] + *local_178 + local_178[2] + 2 >> 2;
          local_184 = local_150[1] + local_150[3] + local_178[1] + local_178[3] + 2 >> 2;
          local_188 = (local_120 + local_144) * 0x10 + local_180;
          local_18c = local_17c + local_184;
          local_70 = local_118 + local_144;
          local_60 = local_138;
          local_64 = local_16c;
          local_74 = local_11c;
          local_80 = 8;
          local_84 = 4;
          local_88 = 1;
          local_8c = local_160;
          local_90 = local_164;
          local_94 = local_15c;
          local_98 = 1;
          local_9c = local_188 & 0x1f;
          local_a0 = local_18c & 0x1f;
          local_6304 = (int)local_188 >> 5;
          local_6310 = (int)local_18c >> 5;
          local_a8 = g_tbl_mc_coeff_chroma_hp;
          local_62fc = local_6304;
          if (local_160 < local_6304) {
            local_62fc = local_160;
          }
          if (local_62fc < -0x42) {
            local_6300 = -0x42;
          }
          else {
            if (local_160 < local_6304) {
              local_6304 = local_160;
            }
            local_6300 = local_6304;
          }
          local_78 = local_6300;
          local_6308 = local_6310;
          if (local_164 < local_6310) {
            local_6308 = local_164;
          }
          if (local_6308 < -0x42) {
            local_630c = -0x42;
          }
          else {
            if (local_164 < local_6310) {
              local_6310 = local_164;
            }
            local_630c = local_6310;
          }
          local_7c = local_630c;
          local_54 = (local_630c + 4) * 2 + 4;
          local_50 = local_138;
          if (*(int *)(local_138 + 0x1b8) < local_54) {
            pthread_mutex_lock((pthread_mutex_t *)(local_138 + 0x1c0));
            while (*(int *)(local_50 + 0x1b8) < local_54) {
              pthread_cond_wait((pthread_cond_t *)(local_50 + 0x1e8),
                                (pthread_mutex_t *)(local_50 + 0x1c0));
            }
            pthread_mutex_unlock((pthread_mutex_t *)(local_50 + 0x1c0));
          }
          local_b0 = (pel *)(*(long *)(local_60 + 0x10) + (long)(local_7c * local_64) +
                            (long)(local_78 << 1));
          if ((local_9c == 0) && (local_a0 == 0)) {
            (*uavs3d_funs_handle.ipcpy[local_88])
                      (local_b0,local_64,local_70,local_74,local_80,local_84);
          }
          else if (local_a0 == 0) {
            (*uavs3d_funs_handle.ipflt[1][local_88])
                      (local_b0,local_64,local_70,local_74,local_80,local_84,local_a8[(int)local_9c]
                       ,local_94);
          }
          else if (local_9c == 0) {
            (*(*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
                (uavs3d_funs_handle.ipflt_ext + -1))[local_88])
                      (local_b0,local_64,local_70,local_74,local_80,local_84,local_a8[(int)local_a0]
                       ,local_94);
          }
          else {
            (*uavs3d_funs_handle.avg_pel[(long)local_88 + -6])
                      (local_b0,local_64,local_70,(pel *)local_74,local_80,local_84);
          }
          local_150 = local_150 + 4;
          local_178 = local_178 + 4;
        }
        local_118 = local_118 + (local_11c << 2);
        local_150 = local_150 + (long)local_168 * 2;
        local_178 = local_178 + (long)local_168 * 2;
      }
    }
    else {
      for (local_148 = 0; local_148 < local_12c; local_148 = local_148 + 8) {
        local_190 = (local_124 + local_148) * 0x10;
        for (local_144 = 0; local_144 < local_128; local_144 = local_144 + 8) {
          local_194 = (local_120 + local_144) * 0x10 + *local_150;
          local_198 = local_190 + local_150[1];
          local_c8 = local_118 + local_144;
          local_b8 = local_138;
          local_bc = local_16c;
          local_cc = local_11c;
          local_d8 = 8;
          local_dc = 4;
          local_e0 = 1;
          local_e4 = local_160;
          local_e8 = local_164;
          local_ec = local_15c;
          local_f0 = 1;
          local_f4 = local_194 & 0x1f;
          local_f8 = local_198 & 0x1f;
          local_631c = (int)local_194 >> 5;
          local_6328 = (int)local_198 >> 5;
          local_100 = g_tbl_mc_coeff_chroma_hp;
          local_6314 = local_631c;
          if (local_160 < local_631c) {
            local_6314 = local_160;
          }
          if (local_6314 < -0x42) {
            local_6318 = -0x42;
          }
          else {
            if (local_160 < local_631c) {
              local_631c = local_160;
            }
            local_6318 = local_631c;
          }
          local_d0 = local_6318;
          local_6320 = local_6328;
          if (local_164 < local_6328) {
            local_6320 = local_164;
          }
          if (local_6320 < -0x42) {
            local_6324 = -0x42;
          }
          else {
            if (local_164 < local_6328) {
              local_6328 = local_164;
            }
            local_6324 = local_6328;
          }
          local_d4 = local_6324;
          local_44 = (local_6324 + 4) * 2 + 4;
          local_40 = local_138;
          if (*(int *)(local_138 + 0x1b8) < local_44) {
            pthread_mutex_lock((pthread_mutex_t *)(local_138 + 0x1c0));
            while (*(int *)(local_40 + 0x1b8) < local_44) {
              pthread_cond_wait((pthread_cond_t *)(local_40 + 0x1e8),
                                (pthread_mutex_t *)(local_40 + 0x1c0));
            }
            pthread_mutex_unlock((pthread_mutex_t *)(local_40 + 0x1c0));
          }
          local_108 = (pel *)(*(long *)(local_b8 + 0x10) + (long)(local_d4 * local_bc) +
                             (long)(local_d0 << 1));
          if ((local_f4 == 0) && (local_f8 == 0)) {
            (*uavs3d_funs_handle.ipcpy[local_e0])
                      (local_108,local_bc,local_c8,local_cc,local_d8,local_dc);
          }
          else if (local_f8 == 0) {
            (*uavs3d_funs_handle.ipflt[1][local_e0])
                      (local_108,local_bc,local_c8,local_cc,local_d8,local_dc,
                       local_100[(int)local_f4],local_ec);
          }
          else if (local_f4 == 0) {
            (*(*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
                (uavs3d_funs_handle.ipflt_ext + -1))[local_e0])
                      (local_108,local_bc,local_c8,local_cc,local_d8,local_dc,
                       local_100[(int)local_f8],local_ec);
          }
          else {
            (*uavs3d_funs_handle.avg_pel[(long)local_e0 + -6])
                      (local_108,local_bc,local_c8,(pel *)local_cc,local_d8,local_dc);
          }
          local_150 = local_150 + 2;
        }
        local_118 = local_118 + (local_11c << 2);
      }
    }
    local_62ac = (uint)((local_62ac != 0 ^ 0xffU) & 1);
  }
  if (uVar2 != 0) {
    if ((short)local_268[3] == 0) {
      local_62c8 = *(int *)(local_278 + 0x1c);
      local_62c0 = (pel *)(*(long *)(local_278 + 0x10) + (long)((local_280 / 2) * local_62c8) +
                          (long)local_27c);
    }
    else {
      local_62c8 = local_284;
      local_62c0 = local_270 + iVar3;
    }
    (*uavs3d_funs_handle.avg_pel[(int)local_268[0x80f] + -2])
              (local_62c0,local_62c8,local_270 + iVar3,local_62a0,local_284,local_288 >> 1);
  }
  return;
}

Assistant:

void com_mc_affine(com_core_t *core, pel *pred_buf)
{
    com_pic_t *pic = core->pic;
    int x = core->cu_pix_x;
    int y = core->cu_pix_y;
    int cu_width = core->cu_width;
    int cu_height = core->cu_height;
    com_ref_pic_t(*refp)[REFP_NUM] = core->refp;
    s8 *refi = core->refi;
    com_pic_t *ref_pic;
    ALIGNED_32(pel pred_snd[MAX_CU_DIM + MAX_CU_DIM / 2]);
    int sub_blk_size;
    int bi = REFI_IS_VALID(refi[REFP_0]) && REFI_IS_VALID(refi[REFP_1]);
    int lidx, lidx_base = REFI_IS_VALID(refi[REFP_0]) ? REFP_0 : REFP_1;
    pel *dstl, *dstc;
    int i_dstl, i_dstc;
    int blk_dim = cu_width * cu_height;

    if (core->pichdr->affine_subblock_size_idx == 1 || (REFI_IS_VALID(refi[REFP_0]) && REFI_IS_VALID(refi[REFP_1]))) {
        sub_blk_size = 8;
    } else {
        sub_blk_size = 4;
    }

    lidx = lidx_base;

    for (int i = 0; i <= bi; i++) {
        ref_pic = refp[refi[lidx]][lidx].pic;

        if (i) {
            i_dstl = cu_width;
            dstl = pred_snd;
        } else if (!bi && !M32(core->cbfy)) {
            i_dstl = pic->stride_luma;
            dstl = pic->y + y * i_dstl + x;
        } else {
            i_dstl = cu_width;
            dstl = pred_buf;
        }
        com_affine_mc_luma(core, dstl, i_dstl, x, y, cu_width, cu_height, ref_pic, sub_blk_size, lidx);
        lidx = !lidx;
    }
    if (bi) {
        if (!M32(core->cbfy)) {
            i_dstl = pic->stride_luma;
            dstl = pic->y + y * i_dstl + x;
        } else {
            i_dstl = cu_width;
            dstl = pred_buf;
        }
        uavs3d_funs_handle.avg_pel[core->cu_log2w - 2](dstl, i_dstl, pred_buf, pred_snd, cu_width, cu_height);
    }

    lidx = lidx_base;

    for (int i = 0; i <= bi; i++) {
        ref_pic = refp[refi[lidx]][lidx].pic;

        if (i) {
            i_dstc = cu_width;
            dstc = pred_snd;
        } else if (!bi && !M16(core->cbfc)) {
            i_dstc = pic->stride_chroma;
            dstc = pic->uv + y / 2 * i_dstc + x;
        } else {
            i_dstc = cu_width;
            dstc = pred_buf + blk_dim;
        }
        com_affine_mc_chroma(core, dstc, i_dstc, x, y, cu_width, cu_height, ref_pic, sub_blk_size, lidx);
        lidx = !lidx;
    }
    if (bi) {
        if (!M16(core->cbfc)) {
            i_dstc = pic->stride_chroma;
            dstc = pic->uv + y / 2 * i_dstc + x;
        } else {
            i_dstc = cu_width;
            dstc = pred_buf + blk_dim;
        }
        uavs3d_funs_handle.avg_pel[core->cu_log2w - 2](dstc, i_dstc, pred_buf + blk_dim, pred_snd, cu_width, cu_height >> 1);
    }
}